

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

vector<Card,_std::allocator<Card>_> * __thiscall
Game::getValidCards(vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Game *this,
                   size_t playerID,Card *c)

{
  Card *pCVar1;
  bool bVar2;
  reference pvVar3;
  Card *pCVar4;
  Card card;
  Card local_38;
  
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = std::
           vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
           ::at(&this->m_playerCards,playerID);
  pCVar1 = (pvVar3->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pCVar4 = (pvVar3->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    local_38 = *pCVar4;
    bVar2 = checkValidCard(this,playerID,*c,local_38);
    if (bVar2) {
      std::vector<Card,_std::allocator<Card>_>::push_back(__return_storage_ptr__,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> Game::getValidCards(size_t playerID, Card &c) {
    std::vector<Card> validCards = std::vector<Card>();
    for (Card card : m_playerCards.at(playerID)) {
        if (checkValidCard(playerID, c, card))
            validCards.push_back(card);
    }
    return validCards;
}